

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzplane.cpp
# Opt level: O3

bool __thiscall TPZPlane::Belongs(TPZPlane *this,TPZVec<double> *ponto)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  
  pdVar1 = (this->fCoef).fStore;
  dVar3 = 0.0;
  lVar2 = 0;
  do {
    dVar3 = dVar3 + ponto->fStore[lVar2] * pdVar1[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return ABS(dVar3 + pdVar1[3]) < 9e-06;
}

Assistant:

bool TPZPlane::Belongs(const TPZVec<REAL> &ponto){
	REAL aux=0.0;
	int i;
	
	for(i=0;i<3;i++){
		aux = aux + ponto[i]*fCoef[i];
	}
	aux = aux + fCoef[3];
	if(fabs(aux)<0.000009) {
		return true;
	}
	else return false;
}